

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_style_pop_color(nk_context *ctx)

{
  nk_config_stack_color *pnVar1;
  nk_config_stack_color_element *pnVar2;
  int iVar3;
  nk_config_stack_color_element *element;
  nk_config_stack_color *type_stack;
  nk_context *ctx_local;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x4306,"int nk_style_pop_color(struct nk_context *)");
  }
  if (ctx == (nk_context *)0x0) {
    ctx_local._4_4_ = 0;
  }
  else {
    pnVar1 = &(ctx->stacks).colors;
    if (pnVar1->head < 1) {
      __assert_fail("type_stack->head > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                    ,0x4306,"int nk_style_pop_color(struct nk_context *)");
    }
    if (pnVar1->head < 1) {
      ctx_local._4_4_ = 0;
    }
    else {
      iVar3 = pnVar1->head + -1;
      pnVar1->head = iVar3;
      pnVar2 = (ctx->stacks).colors.elements + iVar3;
      *pnVar2->address = pnVar2->old_value;
      ctx_local._4_4_ = 1;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

NK_API int
nk_style_set_cursor(struct nk_context *ctx, enum nk_style_cursor c)
{
    struct nk_style *style;
    NK_ASSERT(ctx);
    if (!ctx) return 0;
    style = &ctx->style;
    if (style->cursors[c]) {
        style->cursor_active = style->cursors[c];
        return 1;
    }
    return 0;
}